

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.hpp
# Opt level: O1

vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
* __thiscall
plot::detail::
vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>,plot::Frame<plot::RealCanvas<plot::BrailleCanvas>*>>
::next_impl<0ul,1ul>(void *param_1,undefined8 *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  
  lVar12 = this[0xb];
  lVar13 = this[9];
  bVar17 = this[0xf] != this[3] || this[5] != this[0x11];
  bVar9 = this[0x15] == lVar13;
  bVar10 = this[0x17] == lVar12;
  lVar1 = this[10];
  lVar2 = this[0xd];
  bVar11 = bVar17;
  if (!bVar9 || !bVar10) {
    if (lVar12 == lVar2 || lVar13 != 0) {
      lVar13 = lVar13 + 1;
    }
    else {
      lVar12 = lVar12 + *(long *)(lVar1 + 8) * 0x14;
    }
    bVar11 = false;
  }
  lVar16 = this[3];
  lVar3 = this[4];
  lVar15 = this[5];
  lVar4 = this[7];
  if (bVar11) {
    if (lVar15 == lVar4 || lVar16 != 0) {
      lVar16 = lVar16 + 1;
    }
    else {
      lVar15 = lVar15 + *(long *)(lVar3 + 8) * 0x14;
    }
  }
  uVar5 = this[8];
  uVar6 = this[0xc];
  uVar7 = this[2];
  uVar8 = this[6];
  bVar11 = this[0x15] != lVar13 || this[0x17] != lVar12;
  if (bVar9 && bVar10) {
    bVar11 = bVar17 != (this[0xf] == lVar16 && this[0x11] == lVar15) &&
             (this[0x15] == lVar13 && this[0x17] == lVar12);
  }
  if (bVar11) {
    uVar14 = 0;
  }
  else {
    uVar14 = *(undefined8 *)*this;
  }
  *(undefined8 **)param_1 = (undefined8 *)*this;
  *(undefined8 *)((long)param_1 + 8) = uVar14;
  *(undefined8 *)((long)param_1 + 0x10) = uVar7;
  *(long *)((long)param_1 + 0x18) = lVar16;
  *(long *)((long)param_1 + 0x20) = lVar3;
  *(long *)((long)param_1 + 0x28) = lVar15;
  *(undefined8 *)((long)param_1 + 0x30) = uVar8;
  *(long *)((long)param_1 + 0x38) = lVar4;
  *(undefined8 *)((long)param_1 + 0x40) = uVar5;
  *(long *)((long)param_1 + 0x48) = lVar13;
  *(long *)((long)param_1 + 0x50) = lVar1;
  *(long *)((long)param_1 + 0x58) = lVar12;
  *(undefined8 *)((long)param_1 + 0x60) = uVar6;
  *(long *)((long)param_1 + 0x68) = lVar2;
  uVar5 = this[0xf];
  uVar6 = this[0x10];
  uVar7 = this[0x11];
  uVar8 = this[0x12];
  uVar14 = this[0x13];
  *(undefined8 *)((long)param_1 + 0x70) = this[0xe];
  *(undefined8 *)((long)param_1 + 0x78) = uVar5;
  *(undefined8 *)((long)param_1 + 0x80) = uVar6;
  *(undefined8 *)((long)param_1 + 0x88) = uVar7;
  *(undefined8 *)((long)param_1 + 0x90) = uVar8;
  *(undefined8 *)((long)param_1 + 0x98) = uVar14;
  uVar5 = this[0x15];
  uVar6 = this[0x16];
  uVar7 = this[0x17];
  uVar8 = this[0x18];
  uVar14 = this[0x19];
  *(undefined8 *)((long)param_1 + 0xa0) = this[0x14];
  *(undefined8 *)((long)param_1 + 0xa8) = uVar5;
  *(undefined8 *)((long)param_1 + 0xb0) = uVar6;
  *(undefined8 *)((long)param_1 + 0xb8) = uVar7;
  *(undefined8 *)((long)param_1 + 0xc0) = uVar8;
  *(undefined8 *)((long)param_1 + 200) = uVar14;
  return (vbox_line<plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>,_plot::Frame<plot::RealCanvas<plot::BrailleCanvas>_*>_>
          *)param_1;
}

Assistant:

vbox_line next_impl(std::index_sequence<N...> indices) const {
            auto current = current_index(indices);
            block_iterators nxt(((N != current) ? std::get<N>(lines_) : std::next(std::get<N>(lines_)))...);
            return {
                vbox_,
                (find_true((std::get<N>(nxt) != std::get<N>(ends_))...) != current) ? vbox_->margin_ : 0,
                nxt,
                ends_
            };
        }